

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void xatlas::internal::TaskScheduler::workerThread
               (TaskScheduler *scheduler,Worker *worker,uint32_t threadIndex)

{
  uint uVar1;
  bool bVar2;
  __int_type_conflict _Var3;
  uint32_t uVar4;
  uint32_t *puVar5;
  uint local_5c;
  Task *pTStack_58;
  uint32_t i;
  Task *task;
  TaskGroup *group;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  uint32_t threadIndex_local;
  Worker *worker_local;
  TaskScheduler *scheduler_local;
  
  lock._12_4_ = threadIndex;
  puVar5 = (uint32_t *)__tls_get_addr(&PTR_00167fb8);
  *puVar5 = threadIndex;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&worker->mutex);
LAB_0013273f:
  std::condition_variable::
  wait<xatlas::internal::TaskScheduler::workerThread(xatlas::internal::TaskScheduler*,xatlas::internal::TaskScheduler::Worker*,unsigned_int)::_lambda()_1_>
            (&worker->cv,(unique_lock<std::mutex> *)local_30,(anon_class_8_1_728644bc)worker);
  std::atomic<bool>::operator=(&worker->wakeup,false);
  do {
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&scheduler->m_shutdown);
    if (bVar2) {
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
      return;
    }
    task = (Task *)0x0;
    pTStack_58 = (Task *)0x0;
    for (local_5c = 0; local_5c < scheduler->m_maxGroups; local_5c = local_5c + 1) {
      task = (Task *)(scheduler->m_groups + local_5c);
      bVar2 = std::atomic::operator_cast_to_bool((atomic *)task);
      if ((!bVar2) &&
         (_Var3 = std::__atomic_base::operator_cast_to_unsigned_int
                            ((__atomic_base *)&((TaskGroup *)task)->ref), _Var3 != 0)) {
        Spinlock::lock(&((TaskGroup *)task)->queueLock);
        uVar1 = ((TaskGroup *)task)->queueHead;
        uVar4 = Array<xatlas::internal::Task>::size(&((TaskGroup *)task)->queue);
        if (uVar1 < uVar4) {
          uVar4 = ((TaskGroup *)task)->queueHead;
          ((TaskGroup *)task)->queueHead = uVar4 + 1;
          pTStack_58 = Array<xatlas::internal::Task>::operator[](&((TaskGroup *)task)->queue,uVar4);
          Spinlock::unlock(&((TaskGroup *)task)->queueLock);
          break;
        }
        Spinlock::unlock(&((TaskGroup *)task)->queueLock);
      }
    }
    if (pTStack_58 == (Task *)0x0) goto LAB_0013273f;
    (*pTStack_58->func)(task[3].func,pTStack_58->userData);
    std::__atomic_base<unsigned_int>::operator--((__atomic_base<unsigned_int> *)&task[2].userData,0)
    ;
  } while( true );
}

Assistant:

static void workerThread(TaskScheduler *scheduler, Worker *worker, uint32_t threadIndex)
	{
		m_threadIndex = threadIndex;
		std::unique_lock<std::mutex> lock(worker->mutex);
		for (;;) {
			worker->cv.wait(lock, [=]{ return worker->wakeup.load(); });
			worker->wakeup = false;
			for (;;) {
				if (scheduler->m_shutdown)
					return;
				// Look for a task in any of the groups and run it.
				TaskGroup *group = nullptr;
				Task *task = nullptr;
				for (uint32_t i = 0; i < scheduler->m_maxGroups; i++) {
					group = &scheduler->m_groups[i];
					if (group->free || group->ref == 0)
						continue;
					group->queueLock.lock();
					if (group->queueHead < group->queue.size()) {
						task = &group->queue[group->queueHead++];
						group->queueLock.unlock();
						break;
					}
					group->queueLock.unlock();
				}
				if (!task)
					break;
				task->func(group->userData, task->userData);
				group->ref--;
			}
		}
	}